

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableElimination.cpp
# Opt level: O3

PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
* __thiscall
Inferences::ALASCA::
PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
::next(PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
       *this)

{
  ulong *puVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong *puVar6;
  allocator_type local_72;
  bool local_71;
  vector<bool,_std::allocator<bool>_> local_70;
  OptionBase<std::vector<bool,_std::allocator<bool>_>_> local_48;
  
  if (this[0x20] ==
      (PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
       )0x0) {
    local_71 = false;
    std::vector<bool,_std::allocator<bool>_>::vector
              (&local_70,*(long *)(this + 0x10) - *(long *)(this + 8) >> 6,&local_71,&local_72);
    local_48._elem._elem.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage =
         local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_end_of_storage;
    local_48._elem._elem.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
         local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._M_p;
    local_48._elem._elem.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
         local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p;
    local_48._isSome = true;
    local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
    local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    Lib::OptionBase<std::vector<bool,_std::allocator<bool>_>_>::operator=
              ((OptionBase<std::vector<bool,_std::allocator<bool>_>_> *)(this + 0x20),&local_48);
    Lib::OptionBase<std::vector<bool,_std::allocator<bool>_>_>::~OptionBase(&local_48);
    if (local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    }
    if (*(long *)(this + 0x10) != *(long *)(this + 8)) {
      return (PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
              *)this;
    }
  }
  else {
    puVar1 = *(ulong **)(this + 0x28);
    uVar2 = *puVar1;
    uVar4 = 1;
    if ((uVar2 & 1) == 0) {
      uVar5 = 1;
      puVar6 = puVar1;
    }
    else {
      uVar5 = 1;
      uVar3 = 1;
      puVar6 = puVar1;
      do {
        *puVar6 = ~uVar5 & uVar2;
        puVar6 = puVar1 + (uVar3 >> 6);
        uVar5 = 1L << ((byte)uVar3 & 0x3f);
        uVar2 = *puVar6;
        uVar4 = (ulong)uVar3;
        uVar3 = uVar3 + 1;
      } while ((uVar2 >> (uVar4 & 0x3f) & 1) != 0);
      uVar4 = (ulong)uVar3;
    }
    *puVar6 = uVar5 | uVar2;
    if (uVar4 < (ulong)(*(long *)(this + 0x10) - *(long *)(this + 8) >> 6)) {
      return (PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
              *)this;
    }
  }
  this[0x50] = (PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                )0x1;
  return (PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
          *)this;
}

Assistant:

PartitionIter& next() { 
    if (_partition.isNone()) {
      _partition = some(std::vector<bool>(_orig.size(), false));
      if (_orig.size() == 0) {
        _finished = true;
      }
    } else {
      auto& par = _partition.unwrap();
      unsigned i = 0;
      for (; par[i]; i++) {
        par[i] = !par[i];
      }
      par[i] = !par[i];
      if (i + 1 >= _orig.size()) {
        _finished = true;
      }
    }
    return *this;
  }